

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O0

void __thiscall
Sequence::make_itemset(Sequence *this,Itemset_S *it,Array_S *ary,int cnt,vint *clscnt)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  __shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  element_type *this_02;
  const_reference pvVar4;
  uint local_34;
  int i;
  vint *clscnt_local;
  int cnt_local;
  Array_S *ary_local;
  Itemset_S *it_local;
  Sequence *this_local;
  
  local_34 = 0;
  while( true ) {
    peVar2 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)ary)
    ;
    iVar1 = Array::size(peVar2);
    if (iVar1 <= (int)local_34) break;
    peVar3 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)it
                       );
    this_00 = (__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              Itemset::ival(peVar3);
    peVar2 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (this_00);
    this_01 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                        ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)ary
                        );
    iVar1 = Array::operator[](this_01,local_34);
    Array::optadd(peVar2,iVar1);
    local_34 = local_34 + 1;
  }
  peVar3 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)it);
  Itemset::set_support(peVar3,cnt);
  local_34 = 0;
  while( true ) {
    this_02 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                         )&this->cls);
    iVar1 = ClassInfo::get_num_class(this_02);
    if (iVar1 <= (int)local_34) break;
    peVar3 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)it
                       );
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](clscnt,(long)(int)local_34);
    Itemset::set_cls_support(peVar3,*pvVar4,local_34);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void Sequence::make_itemset(Itemset_S& it, Array_S& ary, int cnt, const vint &clscnt) {
    int i;
    for (i = 0; i < ary->size(); i++) {
        it->ival()->optadd((*ary)[i]);
    }
    it->set_support(cnt);
    for (i = 0; i < cls->get_num_class(); i++) it->set_cls_support(clscnt[i], i);
}